

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int rar_br_preparation(archive_read *a,rar_br *br)

{
  void *pvVar1;
  ssize_t *in_RSI;
  archive *in_RDI;
  rar *rar;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (0 < *(long *)(*(long *)in_RDI[0x15].archive_format_name + 0xa0)) {
    pvVar1 = rar_read_ahead((archive_read *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (size_t)in_RDI,in_RSI);
    in_RSI[3] = (ssize_t)pvVar1;
    if (in_RSI[3] == 0) {
      archive_set_error(in_RDI,0x54,"Truncated RAR file data");
      return -0x1e;
    }
    if ((int)in_RSI[1] == 0) {
      rar_br_fillup((archive_read *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (rar_br *)in_RDI);
    }
  }
  return 0;
}

Assistant:

static int
rar_br_preparation(struct archive_read *a, struct rar_br *br)
{
  struct rar *rar = (struct rar *)(a->format->data);

  if (rar->bytes_remaining > 0) {
    br->next_in = rar_read_ahead(a, 1, &(br->avail_in));
    if (br->next_in == NULL) {
      archive_set_error(&a->archive,
          ARCHIVE_ERRNO_FILE_FORMAT,
          "Truncated RAR file data");
      return (ARCHIVE_FATAL);
    }
    if (br->cache_avail == 0)
      (void)rar_br_fillup(a, br);
  }
  return (ARCHIVE_OK);
}